

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeImageGetDeviceOffsetExp(ze_image_handle_t hImage,uint64_t *pDeviceOffset)

{
  ze_pfnImageGetDeviceOffsetExp_t pfnGetDeviceOffsetExp;
  ze_result_t result;
  uint64_t *pDeviceOffset_local;
  ze_image_handle_t hImage_local;
  
  pfnGetDeviceOffsetExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c4e0 != (code *)0x0) {
    pfnGetDeviceOffsetExp._4_4_ = (*DAT_0011c4e0)(hImage,pDeviceOffset);
  }
  return pfnGetDeviceOffsetExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageGetDeviceOffsetExp(
        ze_image_handle_t hImage,                       ///< [in] handle of the image
        uint64_t* pDeviceOffset                         ///< [out] bindless device offset for image
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDeviceOffsetExp = context.zeDdiTable.ImageExp.pfnGetDeviceOffsetExp;
        if( nullptr != pfnGetDeviceOffsetExp )
        {
            result = pfnGetDeviceOffsetExp( hImage, pDeviceOffset );
        }
        else
        {
            // generic implementation
        }

        return result;
    }